

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  char **ppcVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  stat buf;
  undefined8 local_c0 [3];
  uint local_a8;
  
  *zBuf = '\0';
  if (sqlite3Config.bCoreMutex == '\0') {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  ppcVar4 = &sqlite3_temp_directory;
  lVar5 = 0;
  while( true ) {
    pcVar7 = *ppcVar4;
    if ((((pcVar7 != (char *)0x0) && (iVar1 = (*aSyscall[4].pCurrent)(pcVar7,local_c0), iVar1 == 0))
        && ((local_a8 & 0xf000) == 0x4000)) &&
       (iVar1 = (*aSyscall[2].pCurrent)(pcVar7,3), iVar1 == 0)) goto LAB_00128776;
    if (lVar5 == 0x30) break;
    ppcVar4 = (char **)((long)azTempDirs + lVar5);
    lVar5 = lVar5 + 8;
  }
  pcVar7 = (char *)0x0;
LAB_00128776:
  if (pcVar7 == (char *)0x0) {
    iVar1 = 0x190a;
  }
  else {
    uVar6 = 0;
    iVar1 = 0;
    do {
      sqlite3_randomness(8,local_c0);
      zBuf[(long)nBuf + -2] = '\0';
      sqlite3_snprintf(nBuf,zBuf,"%s/etilqs_%llx%c",pcVar7,local_c0[0],0);
      if (10 < uVar6) {
        iVar1 = 1;
      }
      if (zBuf[(long)nBuf + -2] != '\0') {
        iVar1 = 1;
        break;
      }
      if (10 < uVar6) break;
      uVar6 = uVar6 + 1;
      iVar2 = (*aSyscall[2].pCurrent)(zBuf,0);
    } while (iVar2 == 0);
  }
  if (sqlite3Config.bCoreMutex == '\0') {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return iVar1;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;
  int rc = SQLITE_OK;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing.
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  sqlite3_mutex_enter(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  zDir = unixTempFileDir();
  if( zDir==0 ){
    rc = SQLITE_IOERR_GETTEMPPATH;
  }else{
    do{
      u64 r;
      sqlite3_randomness(sizeof(r), &r);
      assert( nBuf>2 );
      zBuf[nBuf-2] = 0;
      sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                       zDir, r, 0);
      if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ){
        rc = SQLITE_ERROR;
        break;
      }
    }while( osAccess(zBuf,0)==0 );
  }
  sqlite3_mutex_leave(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  return rc;
}